

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O0

void __thiscall
p2t::Sweep::FillRightBelowEdgeEvent(Sweep *this,SweepContext *tcx,Edge *edge,Node *node)

{
  Orientation OVar1;
  Node *node_local;
  Edge *edge_local;
  SweepContext *tcx_local;
  Sweep *this_local;
  
  if (node->point->x < edge->p->x) {
    OVar1 = Orient2d(node->point,node->next->point,node->next->next->point);
    if (OVar1 == CCW) {
      FillRightConcaveEdgeEvent(this,tcx,edge,node);
    }
    else {
      FillRightConvexEdgeEvent(this,tcx,edge,node);
      FillRightBelowEdgeEvent(this,tcx,edge,node);
    }
  }
  return;
}

Assistant:

void Sweep::FillRightBelowEdgeEvent(SweepContext& tcx, Edge* edge, Node& node)
{
  if (node.point->x < edge->p->x) {
    if (Orient2d(*node.point, *node.next->point, *node.next->next->point) == CCW) {
      // Concave
      FillRightConcaveEdgeEvent(tcx, edge, node);
    } else{
      // Convex
      FillRightConvexEdgeEvent(tcx, edge, node);
      // Retry this one
      FillRightBelowEdgeEvent(tcx, edge, node);
    }
  }
}